

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O3

LY_ERR schema_mount_create_ctx
                 (lysc_ext_instance *ext,lyd_node *ext_data,ly_bool config,ly_ctx **ext_ctx)

{
  char **ppcVar1;
  uint16_t uVar2;
  LY_ERR err;
  char **ppcVar3;
  lys_module *plVar4;
  lysc_node *plVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  lysc_node *plVar7;
  char *search_dir;
  lysc_node *node;
  uint32_t idx;
  char *sdirs;
  uint32_t local_54;
  char *local_50;
  undefined4 local_44;
  lyd_node *local_40;
  ly_ctx **local_38;
  
  local_50 = (char *)0x0;
  local_54 = 0;
  ppcVar3 = ly_ctx_get_searchdirs(ext->module->ctx);
  if ((ppcVar3 == (char **)0x0) || (*ppcVar3 == (char *)0x0)) {
    search_dir = (char *)0x0;
  }
  else {
    local_44 = (undefined4)CONCAT71(in_register_00000011,config);
    uVar6 = 1;
    local_40 = ext_data;
    local_38 = ext_ctx;
    do {
      err = ly_strcat(&local_50,"%s:");
      if (err != LY_SUCCESS) goto LAB_0019e708;
      ppcVar1 = ppcVar3 + uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (*ppcVar1 != (char *)0x0);
    config = (ly_bool)local_44;
    ext_ctx = local_38;
    ext_data = local_40;
    search_dir = local_50;
  }
  uVar2 = ly_ctx_get_options(ext->module->ctx);
  err = ly_ctx_new_yldata(search_dir,ext_data,(uint)uVar2,ext_ctx);
  if (err == LY_SUCCESS) {
    err = LY_SUCCESS;
    if ((config == '\0') &&
       (plVar4 = ly_ctx_get_module_iter(*ext_ctx,&local_54), plVar4 != (lys_module *)0x0)) {
      do {
        if (plVar4->implemented != '\0') {
          plVar7 = plVar4->compiled->data;
LAB_0019e6b0:
          plVar5 = plVar7;
          if (plVar7 != (lysc_node *)0x0) {
            do {
              do {
                node = plVar5;
                node->flags = node->flags & 0xfffc | 2;
                plVar5 = lysc_node_child(node);
              } while (plVar5 != (lysc_node *)0x0);
              while( true ) {
                if (node == plVar7) {
                  plVar7 = plVar7->next;
                  goto LAB_0019e6b0;
                }
                plVar5 = node->next;
                if (node->next != (lysc_node *)0x0) break;
                node = node->parent;
              }
            } while( true );
          }
        }
        plVar4 = ly_ctx_get_module_iter(*ext_ctx,&local_54);
      } while (plVar4 != (lys_module *)0x0);
    }
  }
  else {
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,ext,LY_LLERR,err,
               "Failed to create context for the schema-mount data.");
  }
LAB_0019e708:
  free(local_50);
  return err;
}

Assistant:

static LY_ERR
schema_mount_create_ctx(const struct lysc_ext_instance *ext, const struct lyd_node *ext_data, ly_bool config,
        struct ly_ctx **ext_ctx)
{
    LY_ERR rc = LY_SUCCESS;
    const char * const *searchdirs;
    char *sdirs = NULL;
    const struct lys_module *mod;
    struct lysc_node *root, *node;
    uint32_t i, idx = 0;

    /* get searchdirs from the current context */
    searchdirs = ly_ctx_get_searchdirs(ext->module->ctx);

    if (searchdirs) {
        /* append them all into a single string */
        for (i = 0; searchdirs[i]; ++i) {
            if ((rc = ly_strcat(&sdirs, "%s" PATH_SEPARATOR, searchdirs[i]))) {
                goto cleanup;
            }
        }
    }

    /* create the context based on the data */
    if ((rc = ly_ctx_new_yldata(sdirs, ext_data, ly_ctx_get_options(ext->module->ctx), ext_ctx))) {
        lyplg_ext_compile_log(NULL, ext, LY_LLERR, rc, "Failed to create context for the schema-mount data.");
        goto cleanup;
    }

    if (!config) {
        /* manually change the config of all schema nodes in all the modules */
        while ((mod = ly_ctx_get_module_iter(*ext_ctx, &idx))) {
            if (!mod->implemented) {
                continue;
            }

            LY_LIST_FOR(mod->compiled->data, root) {
                LYSC_TREE_DFS_BEGIN(root, node) {
                    node->flags &= ~LYS_CONFIG_W;
                    node->flags |= LYS_CONFIG_R;

                    LYSC_TREE_DFS_END(root, node);
                }
            }
        }
    }

cleanup:
    free(sdirs);
    return rc;
}